

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result __thiscall wabt::anon_unknown_7::Validator::OnBrExpr(Validator *this,BrExpr *expr)

{
  this->expr_loc_ = &(expr->super_ExprMixin<(wabt::ExprType)8>).super_Expr.loc;
  if ((expr->var).type_ == Index) {
    TypeChecker::OnBr(&this->typechecker_,(expr->var).field_2.index_);
    return (Result)Ok;
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.h"
                ,0x36,"Index wabt::Var::index() const");
}

Assistant:

Result Validator::OnBrExpr(BrExpr* expr) {
  expr_loc_ = &expr->loc;
  typechecker_.OnBr(expr->var.index());
  return Result::Ok;
}